

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_NodeAssignConst(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,int fConst1)

{
  Ivy_Obj_t *pIVar1;
  long lVar2;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) == 1) {
    if (0 < p->nSimWords) {
      pIVar1 = pObj->pFanout;
      lVar2 = 0;
      do {
        *(uint *)((long)&pIVar1->pFanout + lVar2 * 4) = -(uint)(fConst1 != 0);
        lVar2 = lVar2 + 1;
      } while (lVar2 < p->nSimWords);
    }
    return;
  }
  __assert_fail("Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFraig.c"
                ,0x2c1,"void Ivy_NodeAssignConst(Ivy_FraigMan_t *, Ivy_Obj_t *, int)");
}

Assistant:

void Ivy_NodeAssignConst( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, int fConst1 )
{
    Ivy_FraigSim_t * pSims;
    int i;
    assert( Ivy_ObjIsPi(pObj) );
    pSims = Ivy_ObjSim(pObj);
    for ( i = 0; i < p->nSimWords; i++ )
        pSims->pData[i] = fConst1? ~(unsigned)0 : 0;
}